

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

SubControl __thiscall QComboBoxPrivate::newHoverControl(QComboBoxPrivate *this,QPoint *pos)

{
  long lVar1;
  QWidget *this_00;
  SubControl SVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  QRect QVar4;
  QStyleOptionComboBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  memset(&opt,0xaa,0x90);
  QStyleOptionComboBox::QStyleOptionComboBox(&opt);
  (**(code **)(*(long *)this_00 + 0x1b8))(this_00,&opt);
  opt.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)(QFlagsStorage<QStyle::SubControl>)0xffffffff;
  pQVar3 = QWidget::style(this_00);
  SVar2 = (**(code **)(*(long *)pQVar3 + 0xd0))(pQVar3,1,&opt,pos,this_00);
  this->hoverControl = SVar2;
  if (SVar2 == SC_None) {
    SVar2 = SC_None;
    QVar4 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  }
  else {
    pQVar3 = QWidget::style(this_00);
    QVar4 = (QRect)(**(code **)(*(long *)pQVar3 + 0xd8))(pQVar3,1,&opt,this->hoverControl,this_00);
    SVar2 = this->hoverControl;
  }
  this->hoverRect = QVar4;
  QStyleOptionComboBox::~QStyleOptionComboBox(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

QStyle::SubControl QComboBoxPrivate::newHoverControl(const QPoint &pos)
{
    Q_Q(QComboBox);
    QStyleOptionComboBox opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_All;
    hoverControl = q->style()->hitTestComplexControl(QStyle::CC_ComboBox, &opt, pos, q);
    hoverRect = (hoverControl != QStyle::SC_None)
                   ? q->style()->subControlRect(QStyle::CC_ComboBox, &opt, hoverControl, q)
                   : QRect();
    return hoverControl;
}